

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPostDepthCoverageTests.cpp
# Opt level: O0

int __thiscall gl4cts::PostDepthShaderCase::init(PostDepthShaderCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  allocator<char> local_31;
  string local_30;
  PostDepthShaderCase *local_10;
  PostDepthShaderCase *this_local;
  
  local_10 = this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_post_depth_coverage");
  if (!bVar1) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"GL_ARB_post_depth_coverage not supported",&local_31);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_30);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  std::__cxx11::string::operator=((string *)&this->m_vertShader,c_commonVertShader);
  std::__cxx11::string::operator=
            ((string *)&this->m_fragShader1,
             "#version 450\n\n#extension GL_ARB_post_depth_coverage : require\n\nout vec4 fragColor;\n\nvoid main()\n{\n    fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
            );
  std::__cxx11::string::operator=
            ((string *)&this->m_fragShader2,
             "#version 450\n\n#extension GL_ARB_post_depth_coverage : enable\n\n#ifndef GL_ARB_post_depth_coverage\n  #error GL_ARB_post_depth_coverage not defined\n#else\n  #if (GL_ARB_post_depth_coverage != 1)\n    #error GL_ARB_post_depth_coverage wrong defined\n  #endif\n#endif // GL_ARB_post_depth_coverage\n\nout vec4 fragColor;\n\nvoid main()\n{\n    fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
            );
  std::__cxx11::string::operator=
            ((string *)&this->m_fragShader3,
             "#version 450\n\n#extension GL_ARB_post_depth_coverage : enable\n\nlayout(early_fragment_tests) in;\nlayout(post_depth_coverage) in;\n\nout vec4 fragColor;\n\nvoid main()\n{\n    fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
            );
  iVar2 = std::__cxx11::string::operator=
                    ((string *)&this->m_fragShader4,
                     "#version 450\n\n#extension GL_ARB_post_depth_coverage : enable\n\nlayout(post_depth_coverage) in;\n\nout vec4 fragColor;\n\nvoid main()\n{\n    fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
                    );
  return iVar2;
}

Assistant:

void PostDepthShaderCase::init()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_post_depth_coverage"))
		throw tcu::NotSupportedError("GL_ARB_post_depth_coverage not supported");

	m_vertShader = c_commonVertShader;

	m_fragShader1 = "#version 450\n"
					"\n"
					"#extension GL_ARB_post_depth_coverage : require\n"
					"\n"
					"out vec4 fragColor;\n"
					"\n"
					"void main()\n"
					"{\n"
					"    fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
					"}\n";

	m_fragShader2 = "#version 450\n"
					"\n"
					"#extension GL_ARB_post_depth_coverage : enable\n"
					"\n"
					"#ifndef GL_ARB_post_depth_coverage\n"
					"  #error GL_ARB_post_depth_coverage not defined\n"
					"#else\n"
					"  #if (GL_ARB_post_depth_coverage != 1)\n"
					"    #error GL_ARB_post_depth_coverage wrong defined\n"
					"  #endif\n"
					"#endif // GL_ARB_post_depth_coverage\n"
					"\n"
					"out vec4 fragColor;\n"
					"\n"
					"void main()\n"
					"{\n"
					"    fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
					"}\n";

	m_fragShader3 = "#version 450\n"
					"\n"
					"#extension GL_ARB_post_depth_coverage : enable\n"
					"\n"
					"layout(early_fragment_tests) in;\n"
					"layout(post_depth_coverage) in;\n"
					"\n"
					"out vec4 fragColor;\n"
					"\n"
					"void main()\n"
					"{\n"
					"    fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
					"}\n";

	m_fragShader4 = "#version 450\n"
					"\n"
					"#extension GL_ARB_post_depth_coverage : enable\n"
					"\n"
					"layout(post_depth_coverage) in;\n"
					"\n"
					"out vec4 fragColor;\n"
					"\n"
					"void main()\n"
					"{\n"
					"    fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
					"}\n";
}